

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRuntimeDependencyArchive.cxx
# Opt level: O3

bool __thiscall
cmRuntimeDependencyArchive::IsPostExcluded(cmRuntimeDependencyArchive *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  anon_class_32_1_898f2789_for__M_pred fileMatch;
  anon_class_40_2_f7e7401d_for__M_pred regexMatch;
  RegularExpressionMatch match;
  anon_class_8_1_c61d8849 *local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_110;
  anon_class_8_1_c61d8849 local_108 [2];
  anon_class_8_1_60cb577c local_f8;
  long *local_f0 [2];
  long local_e0 [2];
  anon_class_40_2_f7e7401d_for__M_pred local_d0 [4];
  
  memset(local_d0,0,0xa8);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_f8.regexMatch = local_d0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f0,pcVar1,pcVar1 + name->_M_string_length);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,pcVar1,pcVar1 + name->_M_string_length);
  bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()(local_118,local_110);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                      (&local_f8,
                       (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *)(this->PostIncludeRegexes).
                          super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    if (!bVar2) {
      bVar2 = IsPostExcluded::anon_class_8_1_c61d8849::operator()(local_118,local_110);
      if (!bVar2) {
        bVar2 = IsPostExcluded::anon_class_8_1_60cb577c::operator()
                          (&local_f8,
                           (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                            *)(this->PostExcludeRegexes).
                              super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        if (!bVar2) {
          bVar3 = IsPostExcluded::anon_class_8_1_c61d8849::operator()(local_118,local_110);
        }
        goto LAB_004b394d;
      }
    }
    bVar3 = false;
  }
LAB_004b394d:
  if (local_118 != local_108) {
    operator_delete(local_118,(ulong)((long)&((local_108[0].fileMatch)->name)._M_dataplus._M_p + 1))
    ;
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return bVar3;
}

Assistant:

bool cmRuntimeDependencyArchive::IsPostExcluded(const std::string& name) const
{
  cmsys::RegularExpressionMatch match;
  auto const regexMatch =
    [&match, name](const cmsys::RegularExpression& regex) -> bool {
    return regex.find(name.c_str(), match);
  };
  auto const regexSearch =
    [&regexMatch](
      const std::vector<cmsys::RegularExpression>& regexes) -> bool {
    return std::any_of(regexes.begin(), regexes.end(), regexMatch);
  };
  auto const fileMatch = [name](const std::string& file) -> bool {
    return cmSystemTools::SameFile(file, name);
  };
  auto const fileSearch =
    [&fileMatch](const std::vector<std::string>& files) -> bool {
    return std::any_of(files.begin(), files.end(), fileMatch);
  };

  return fileSearch(this->PostExcludeFilesStrict) ||
    (!(regexSearch(this->PostIncludeRegexes) ||
       fileSearch(this->PostIncludeFiles)) &&
     (regexSearch(this->PostExcludeRegexes) ||
      fileSearch(this->PostExcludeFiles)));
}